

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deal.cpp
# Opt level: O2

void __thiscall Deal::bidding(Deal *this)

{
  Player *pPVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  Contract *pCVar4;
  int iVar5;
  char *pcVar6;
  int iVar7;
  Cursor local_44;
  Erase local_38;
  Contract *c;
  
  iVar5 = this->_contractor;
  if (iVar5 == -1) {
    iVar5 = this->_dealer;
  }
  iVar7 = 0;
  AdvancedConsole::Erase::Erase((Erase *)&local_44,AC_ALL,AC_SCREEN);
  AdvancedConsole::operator<<((ostream *)&std::cout,(Erase *)&local_44);
  AdvancedConsole::Cursor::Cursor(&local_44,0,0,AC_ABSOLUTE);
  poVar3 = AdvancedConsole::operator<<((ostream *)&std::cout,&local_44);
  std::operator<<(poVar3,"Proposes:");
  do {
    while( true ) {
      iVar5 = (iVar5 + 1) % 4;
      if ((2 < iVar7) && ((iVar7 != 3 || (this->_contract != (Contract *)0x0)))) {
        this->_state = Playing;
        makeMemento(this);
        return;
      }
      AdvancedConsole::Cursor::Cursor(&local_44,6,0,AC_ABSOLUTE);
      poVar3 = AdvancedConsole::operator<<((ostream *)&std::cout,&local_44);
      AdvancedConsole::Erase::Erase(&local_38,AC_ALL,AC_LINE);
      poVar3 = AdvancedConsole::operator<<(poVar3,&local_38);
      poVar3 = std::operator<<(poVar3,"Player: ");
      poVar3 = operator<<(poVar3,(this->_players)._M_elems[iVar5]);
      std::endl<char,std::char_traits<char>>(poVar3);
      pPVar1 = (this->_players)._M_elems[iVar5];
      iVar2 = (*(pPVar1->super_Serializable)._vptr_Serializable[1])(pPVar1,this->_contract);
      c = (Contract *)CONCAT44(extraout_var,iVar2);
      AdvancedConsole::Cursor::Cursor(&local_44,iVar5 + 2,0,AC_ABSOLUTE);
      poVar3 = AdvancedConsole::operator<<((ostream *)&std::cout,&local_44);
      AdvancedConsole::Erase::Erase(&local_38,AC_ALL,AC_LINE);
      AdvancedConsole::operator<<(poVar3,&local_38);
      pCVar4 = Contract::Pass();
      if (c != pCVar4) break;
      poVar3 = operator<<((ostream *)&std::cout,(this->_players)._M_elems[iVar5]);
      pcVar6 = " passed";
LAB_0010c12d:
      poVar3 = std::operator<<(poVar3,pcVar6);
      std::endl<char,std::char_traits<char>>(poVar3);
      iVar7 = iVar7 + 1;
    }
    if ((this->_contract != (Contract *)0x0) && (c <= this->_contract)) {
      pcVar6 = "Error, contract lower than the previous one";
      poVar3 = (ostream *)&std::cout;
      goto LAB_0010c12d;
    }
    poVar3 = operator<<((ostream *)&std::cout,(this->_players)._M_elems[iVar5]);
    poVar3 = std::operator<<(poVar3," proposed ");
    poVar3 = operator<<(poVar3,c);
    std::endl<char,std::char_traits<char>>(poVar3);
    this->_contract = c;
    this->_contractor = iVar5;
    makeMemento(this);
    iVar7 = 0;
  } while( true );
}

Assistant:

void Deal::bidding() {
    int speaker = ((_contractor == -1 ? _dealer : _contractor) + 1) % 4;
    int nbrOfPass = 0;
    Contract *tmp_c;
    cout << AdvancedConsole::Erase();
    cout << AdvancedConsole::Cursor(0, 0) << "Proposes:";
    while ((nbrOfPass < 3) || (nbrOfPass == 3 && _contract == nullptr)) {
        cout << AdvancedConsole::Cursor(6, 0)
             << AdvancedConsole::Erase(AdvancedConsole::AC_ALL, AdvancedConsole::AC_LINE)
             << "Player: " << *_players[speaker] << endl;
        tmp_c = _players[speaker]->proposeContract(_contract);


        cout << AdvancedConsole::Cursor(speaker + 2, 0)
             << AdvancedConsole::Erase(AdvancedConsole::AC_ALL, AdvancedConsole::AC_LINE);
        if (tmp_c == Contract::Pass()) {
            cout << *_players[speaker] << " passed" << endl;
            nbrOfPass++;
        } else if (_contract == nullptr || tmp_c > _contract) {
            cout << *_players[speaker] << " proposed " << *tmp_c << endl;
            nbrOfPass = 0;
            _contract = tmp_c;
            _contractor = speaker;
            makeMemento();
        } else {
            cout << "Error, contract lower than the previous one" << endl;
            nbrOfPass++;
        }
        speaker = (speaker + 1) % 4;
    }

    _state = State::Playing;
    makeMemento();
}